

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall CTPNMemArg::gen_code(CTPNMemArg *this,int discard,int param_2)

{
  CTcPrsNode *pCVar1;
  int varargs;
  CTcNamedArgs named_args;
  uint local_34;
  CTcNamedArgs local_30;
  
  CTPNArglist::gen_code_arglist((this->super_CTPNMemArgBase).arglist_,(int *)&local_34,&local_30);
  pCVar1 = (this->super_CTPNMemArgBase).obj_expr_;
  (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x17])
            (pCVar1,discard,(this->super_CTPNMemArgBase).prop_expr_,
             (ulong)((byte)(this->super_CTPNMemArgBase).field_0x20 & 1),
             (ulong)(uint)(((this->super_CTPNMemArgBase).arglist_)->super_CTPNArglistBase).argc_,
             (ulong)local_34,&local_30);
  return;
}

Assistant:

void CTPNMemArg::gen_code(int discard, int)
{
    /* push the argument list */
    int varargs;
    CTcNamedArgs named_args;
    get_arg_list()->gen_code_arglist(&varargs, named_args);

    /* ask the object expression to generate the code */
    get_obj_expr()->gen_code_member(discard, get_prop_expr(), prop_is_expr_,
                                    get_arg_list()->get_argc(),
                                    varargs, &named_args);
}